

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O0

wchar_t borg_launch_bolt_at_location
                  (wchar_t y,wchar_t x,wchar_t rad,wchar_t dam,wchar_t typ,wchar_t max,
                  wchar_t ammo_location)

{
  ushort uVar1;
  chunk_conflict *pcVar2;
  monster_race *pmVar3;
  int x1_00;
  int y1_00;
  wchar_t wVar4;
  wchar_t y2_00;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  wchar_t wVar8;
  loc_conflict lVar9;
  borg_grid *pbVar10;
  wchar_t q_y;
  wchar_t q_x;
  borg_kill *kill;
  monster_race *r_ptr;
  borg_grid *ag;
  wchar_t n;
  wchar_t r;
  wchar_t dist;
  wchar_t y2;
  wchar_t x2;
  wchar_t y1;
  wchar_t x1;
  wchar_t rx;
  wchar_t ry;
  wchar_t max_local;
  wchar_t typ_local;
  wchar_t dam_local;
  wchar_t rad_local;
  wchar_t x_local;
  wchar_t y_local;
  
  wVar4 = w_x;
  dam_local = x;
  rad_local = y;
  iVar6 = borg_panel_wid();
  wVar8 = w_y;
  iVar6 = wVar4 / iVar6;
  iVar7 = borg_panel_hgt();
  y2_00 = rad_local;
  wVar4 = dam_local;
  y1_00 = borg.c.y;
  x1_00 = borg.c.x;
  pcVar2 = cave;
  iVar7 = wVar8 / iVar7;
  ag._0_4_ = L'\0';
  lVar9 = (loc_conflict)loc(dam_local,rad_local);
  _Var5 = square_in_bounds_fully((chunk *)pcVar2,lVar9);
  pmVar3 = r_info;
  if (_Var5) {
    dam_local = x1_00;
    rad_local = y1_00;
    uVar1 = borg_kills[borg_grids[y2_00][wVar4].kill].r_idx;
    if ((int)(uint)borg_kills[borg_grids[y2_00][wVar4].kill].r_idx < (int)(z_info->r_max - 1)) {
      for (n = L'\x01'; n < max; n = n + L'\x01') {
        borg_inc_motion(&rad_local,&dam_local,y1_00,x1_00,y2_00,wVar4);
        pcVar2 = cave;
        lVar9 = (loc_conflict)loc(dam_local,rad_local);
        _Var5 = square_in_bounds_fully((chunk *)pcVar2,lVar9);
        if (!_Var5) break;
        pbVar10 = borg_grids[rad_local] + dam_local;
        _Var5 = borg_cave_floor_grid(pbVar10);
        if ((!_Var5) || (pbVar10->feat == '\x18')) {
          if ((rad != L'\xffffffff') && (rad != L'\n')) {
            return L'\0';
          }
          return (wchar_t)ag;
        }
        if ((rad < L'\x01') || (rad == L'\n')) {
          wVar8 = borg_launch_bolt_aux_hack((uint)pbVar10->kill,dam,typ,ammo_location);
          ag._0_4_ = wVar8 + (wchar_t)ag;
        }
        if ((((rad != L'\xffffffff') && (rad != L'\n')) && (dam_local == wVar4)) &&
           (rad_local == y2_00)) break;
        if ((rad == L'\0') && (pbVar10->kill != '\0')) {
          return (wchar_t)ag;
        }
        if (borg.trait[0x25] == 0) {
          if (((borg.trait[0x34] < 1) && (pmVar3[uVar1].light < L'\x01')) && (pbVar10->feat == '\0')
             ) {
            if ((rad != L'\xffffffff') && (rad != L'\n')) {
              return L'\0';
            }
            return (wchar_t)ag;
          }
          if (successful_target < L'\0') {
            if (successful_target < L'\xfffffff5') {
              successful_target = L'\0';
            }
            if ((rad != L'\xffffffff') && (rad != L'\n')) {
              return L'\0';
            }
            return (wchar_t)ag;
          }
        }
        else {
          if ((((borg_detect_wall[iVar7][iVar6] & 1U) == 0) &&
              ((borg_detect_wall[iVar7][iVar6 + 1] & 1U) == 0)) &&
             (((borg_detect_wall[iVar7 + 1][iVar6] & 1U) == 0 &&
              (((borg_detect_wall[iVar7 + 1][iVar6 + 1] & 1U) == 0 &&
               ((int)(uint)borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb] < (int)avoidance / 0x14)
               ))))) {
            if (pbVar10->feat == '\0') {
              if ((rad != L'\xffffffff') && (rad != L'\n')) {
                return L'\0';
              }
              return (wchar_t)ag;
            }
            if (successful_target < L'\0') {
              if (successful_target < L'\xfffffff5') {
                successful_target = L'\0';
              }
              if ((rad != L'\xffffffff') && (rad != L'\n')) {
                return L'\0';
              }
              return (wchar_t)ag;
            }
          }
          if (successful_target < L'\0') {
            if (successful_target < L'\xfffffff5') {
              successful_target = L'\0';
            }
            if ((rad != L'\xffffffff') && (rad != L'\n')) {
              return L'\0';
            }
            return (wchar_t)ag;
          }
        }
      }
      if (rad < L'\x01') {
        x_local = (wchar_t)ag;
      }
      else if (n < max) {
        for (x1 = y2_00 - rad; x1 < y2_00 + rad; x1 = x1 + L'\x01') {
          for (y1 = wVar4 - rad; pcVar2 = cave, y1 < wVar4 + rad; y1 = y1 + L'\x01') {
            lVar9 = (loc_conflict)loc(y1,x1);
            _Var5 = square_in_bounds((chunk *)pcVar2,lVar9);
            if (_Var5) {
              pbVar10 = borg_grids[x1] + y1;
              ag._4_4_ = borg_distance(y2_00,wVar4,x1,y1);
              if ((ag._4_4_ <= rad) && (_Var5 = borg_los(y2_00,wVar4,x1,y1), _Var5)) {
                if (rad == L'\n') {
                  ag._4_4_ = L'\0';
                }
                wVar8 = borg_launch_bolt_aux_hack
                                  ((uint)pbVar10->kill,dam / (ag._4_4_ + L'\x01'),typ,ammo_location)
                ;
                ag._0_4_ = wVar8 + (wchar_t)ag;
                if ((pbVar10->take != '\0') &&
                   (borg_takes[pbVar10->take].kind != (object_kind *)0x0)) {
                  wVar8 = borg_launch_destroy_stuff(pbVar10,typ);
                  ag._0_4_ = (wchar_t)ag - wVar8;
                }
              }
            }
          }
        }
        x_local = (wchar_t)ag;
      }
      else {
        x_local = L'\0';
      }
    }
    else {
      x_local = L'\0';
    }
  }
  else {
    x_local = L'\0';
  }
  return x_local;
}

Assistant:

static int borg_launch_bolt_at_location(
    int y, int x, int rad, int dam, int typ, int max, int ammo_location)
{
    int ry, rx;

    int x1, y1;
    int x2, y2;

    int dist;

    int r, n;

    borg_grid           *ag;
    struct monster_race *r_ptr;
    borg_kill           *kill;

    int q_x, q_y;

    /* Extract panel */
    q_x = w_x / borg_panel_wid();
    q_y = w_y / borg_panel_hgt();

    /* Reset damage */
    n = 0;

    /* Initial location */
    x1 = borg.c.x;
    y1 = borg.c.y;

    /* Final location */
    x2 = x;
    y2 = y;

    /* Bounds Check */
    if (!square_in_bounds_fully(cave, loc(x, y)))
        return 0;

    /* Start over */
    x = x1;
    y = y1;

    /* Get the grid of the targetted monster */
    ag = &borg_grids[y2][x2];
    kill = &borg_kills[ag->kill];
    r_ptr = &r_info[kill->r_idx];

    /* "player ghosts" */
    if (kill->r_idx >= z_info->r_max - 1)
        return 0;

    /* Simulate the spell/missile path */
    for (dist = 1; dist < max; dist++) {
        /* Calculate the new location */
        borg_inc_motion(&y, &x, y1, x1, y2, x2);

        /* Bounds Check */
        if (!square_in_bounds_fully(cave, loc(x, y)))
            break;

        /* Get the grid of the pathway */
        ag = &borg_grids[y][x];

        /* Stop at walls */
        /* note if beam, this is the end of the beam */
        /* dispel spells act like beams (sort of) */
        if (!borg_cave_floor_grid(ag) || ag->feat == FEAT_PASS_RUBBLE) {
            if (rad != -1 && rad != 10)
                return 0;
            else
                return n;
        }

        /* Collect damage (bolts/beams) */
        if (rad <= 0 || rad == 10)
            n += borg_launch_bolt_aux_hack(ag->kill, dam, typ, ammo_location);

        /* Check for arrival at "final target" */
        /* except beams, which keep going. */
        if ((rad != -1 && rad != 10) && ((x == x2) && (y == y2)))
            break;

        /* Stop bolts at monsters  */
        if (!rad && ag->kill)
            return n;

        /* The missile path can be complicated.  There are several checks
         * which need to be made.  First we assume that we targeting
         * a monster.  That monster could be known from either sight or
         * ESP.  If the entire pathway from us to the monster is known,
         * then there is no concern.  But if the borg is shooting through
         * unknown grids, then there is a concern when he has ESP; without
         * ESP he would not see that monster if the unknown grids
         * contained walls or closed doors.
         *
         * 1.  ESP Inactive
         *   A.  No Infravision
         *       -Then the monster must be in a lit grid. OK to shoot
         *   B.  Yes Infravision
         *       -Then the monster must be projectable()  OK to shoot
         * 2.  ESP Active
         *   A. No Infravision
         *       -Then the monster could be in a lit grid.  Try to shoot
         *       -Or I detect it with ESP and it's not projectable().
         *   B.  Yes Infravision
         *       -Then the monster could be projectable()
         *       -Or I detect it with ESP and it's not projectable().
         *   -In the cases of ESP Active, the borg will test fire a missile.
         *    Then wait for a 'painful ouch' from the monster.
         *
         * Low level borgs will not take the shot unless they have
         * a clean and known pathway.  Borgs over a certain clevel,
         * will attempt the shot and listen for the 'ouch' response
         * to know that the clear.  If no 'Ouch' is heard, then the
         * borg will assume there is a wall in the way.  Exception to
         * this is with arrows.  Arrows can miss the target or fall
         * fall short, in which case no 'ouch' is heard.  So the borg
         * allowed to miss two shots with arrows/bolts/thrown objects.
         */

        /* dont do the check if esp */
        if (!borg.trait[BI_ESP]) {
            /* Check the missile path--no Infra, no HAS_LIGHT */
            if ((borg.trait[BI_INFRA] <= 0) && !(r_ptr->light > 0)) {
                /* Stop at unknown grids (see above) */
                /* note if beam, dispel, this is the end of the beam */
                if (ag->feat == FEAT_NONE) {
                    if (rad != -1 && rad != 10)
                        return 0;
                    else
                        return n;
                }
            } 

            /* Stop at unseen walls */
            /* We just shot and missed, this is our next shot */
            if (successful_target < 0) {
                /* When throwing things, it is common to just 'miss' */
                /* Skip only one round in this case */
                if (successful_target <= -12)
                    successful_target = 0;
                if (rad != -1 && rad != 10)
                    return 0;
                else
                    return n;
            }
        } else /* I do have ESP */
        {
            /* if this area has been magic mapped,
             * ok to shoot in the dark
             */
            if (!borg_detect_wall[q_y + 0][q_x + 0]
                && !borg_detect_wall[q_y + 0][q_x + 1]
                && !borg_detect_wall[q_y + 1][q_x + 0]
                && !borg_detect_wall[q_y + 1][q_x + 1]
                && borg_fear_region[borg.c.y / 11][borg.c.x / 11]
                < avoidance / 20) {

                /* Stop at unknown grids (see above) */
                /* note if beam, dispel, this is the end of the beam */
                if (ag->feat == FEAT_NONE) {
                    if (rad != -1 && rad != 10)
                        return 0;
                    else
                        return n;
                }
                /* Stop at unseen walls */
                /* We just shot and missed, this is our next shot */
                if (successful_target < 0) {
                    /* When throwing things, it is common to just 'miss' */
                    /* Skip only one round in this case */
                    if (successful_target <= -12)
                        successful_target = 0;
                    if (rad != -1 && rad != 10)
                        return 0;
                    else
                        return n;
                }
            }

            /* Stop at unseen walls */
            /* We just shot and missed, this is our next shot */
            if (successful_target < 0) {
                /* When throwing things, it is common to just 'miss' */
                /* Skip only one round in this case */
                if (successful_target <= -12)
                    successful_target = 0;

                if (rad != -1 && rad != 10)
                    return 0;
                else
                    return n;
            }
        }
    }

    /* Bolt/Beam attack */
    if (rad <= 0)
        return n;

    /* Excessive distance */
    if (dist >= max)
        return 0;

    /* Check monsters and objects in blast radius */
    for (ry = y2 - rad; ry < y2 + rad; ry++) {
        for (rx = x2 - rad; rx < x2 + rad; rx++) {

            /* Bounds check */
            if (!square_in_bounds(cave, loc(rx, ry)))
                continue;

            /* Get the grid */
            ag = &borg_grids[ry][rx];

            /* Check distance */
            r = borg_distance(y2, x2, ry, rx);

            /* Maximal distance */
            if (r > rad)
                continue;

            /* Never pass through walls*/
            if (!borg_los(y2, x2, ry, rx))
                continue;

            /*  dispel spells should hurt the same no matter the rad: make r= y
             * and x */
            if (rad == 10)
                r = 0;

            /* Collect damage, lowered by distance */
            n += borg_launch_bolt_aux_hack(
                ag->kill, dam / (r + 1), typ, ammo_location);

            /* probable damage int was just changed by b_l_b_a_h*/

            /* check destroyed stuff. */
            if (ag->take && borg_takes[ag->take].kind)
                n -= borg_launch_destroy_stuff(ag, typ);
        }
    }

    /* Result */
    return n;
}